

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

bool ON_ClampKnotVector(int order,int cv_count,double *knot,int end)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = false;
  if (((order <= cv_count) && (bVar5 = false, 1 < order)) && (knot != (double *)0x0)) {
    bVar5 = (end & 0xfffffffdU) == 0;
    if (2 < order && bVar5) {
      uVar4 = 0;
      do {
        knot[uVar4] = knot[order - 2];
        uVar4 = uVar4 + 1;
      } while (order - 2 != uVar4);
    }
    if (end - 1U < 2) {
      iVar1 = order + cv_count + -2;
      bVar5 = true;
      if (cv_count < iVar1) {
        lVar2 = (long)cv_count;
        pdVar3 = knot + (uint)cv_count;
        do {
          *pdVar3 = knot[lVar2 + -1];
          pdVar3 = pdVar3 + 1;
          cv_count = cv_count + 1;
        } while (cv_count < iVar1);
      }
    }
  }
  return bVar5;
}

Assistant:

bool ON_ClampKnotVector(
          int order,          // order (>=2)
          int cv_count,       // cv count
          double* knot,       // knot[] array
          int end             // 0 = clamp start, 1 = clamp end, 2 = clamp both ends
          )
{
  // sets initial/final order-2 knot values to match knot[order-2]/knot[cv_count-1]
  bool rc = false;
  int i, i0;
  if ( knot && order >= 2 && cv_count >= order ) {
    if ( end == 0 || end == 2 ) {
      i0 = order-2;
      for ( i = 0; i < i0; i++ ) {
        knot[i] = knot[i0];
      }
      rc = true;
    }
    if ( end == 1 || end == 2 ) {
      const int knot_count = ON_KnotCount(order,cv_count);
      i0 = cv_count-1;
      for ( i = i0+1; i < knot_count; i++ ) {
        knot[i] = knot[i0];
      }
      rc = true;
    }
  }
  return rc;
}